

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderMatrixTests.cpp
# Opt level: O1

string * __thiscall
vkt::sr::(anonymous_namespace)::ShaderMatrixCase::genGLSLMatToVec3Reduction_abi_cxx11_
          (string *__return_storage_ptr__,void *this,DataType *matType,char *varName)

{
  size_t sVar1;
  long lVar2;
  char *pcVar3;
  ostringstream op;
  undefined1 auStack_198 [8];
  long local_190 [14];
  ios_base local_120 [264];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
  switch(*this) {
  case 1:
    if (matType == (DataType *)0x0) {
      std::ios::clear((int)auStack_198 + (int)*(undefined8 *)(local_190[0] + -0x18) + 8);
    }
    else {
      sVar1 = strlen((char *)matType);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,(char *)matType,sVar1)
      ;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,", ",2);
    if (matType == (DataType *)0x0) {
      std::ios::clear((int)auStack_198 + (int)*(undefined8 *)(local_190[0] + -0x18) + 8);
    }
    else {
      sVar1 = strlen((char *)matType);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,(char *)matType,sVar1)
      ;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,", ",2);
  case 3:
    if (matType == (DataType *)0x0) {
      std::ios::clear((int)auStack_198 + (int)*(undefined8 *)(local_190[0] + -0x18) + 8);
    }
    else {
      sVar1 = strlen((char *)matType);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,(char *)matType,sVar1)
      ;
    }
    pcVar3 = "";
    lVar2 = 0;
    break;
  case 2:
    if (matType == (DataType *)0x0) {
      std::ios::clear((int)auStack_198 + (int)*(undefined8 *)(local_190[0] + -0x18) + 8);
    }
    else {
      sVar1 = strlen((char *)matType);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,(char *)matType,sVar1)
      ;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,".x, ",4);
    if (matType == (DataType *)0x0) {
      std::ios::clear((int)auStack_198 + (int)*(undefined8 *)(local_190[0] + -0x18) + 8);
    }
    else {
      sVar1 = strlen((char *)matType);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,(char *)matType,sVar1)
      ;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,".y, ",4);
    if (matType == (DataType *)0x0) {
      std::ios::clear((int)auStack_198 + (int)*(undefined8 *)(local_190[0] + -0x18) + 8);
    }
    else {
      sVar1 = strlen((char *)matType);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,(char *)matType,sVar1)
      ;
    }
    lVar2 = 2;
    pcVar3 = ".x";
    break;
  case 4:
    if (matType == (DataType *)0x0) {
      std::ios::clear((int)auStack_198 + (int)*(undefined8 *)(local_190[0] + -0x18) + 8);
    }
    else {
      sVar1 = strlen((char *)matType);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,(char *)matType,sVar1)
      ;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,".x, ",4);
    if (matType == (DataType *)0x0) {
      std::ios::clear((int)auStack_198 + (int)*(undefined8 *)(local_190[0] + -0x18) + 8);
    }
    else {
      sVar1 = strlen((char *)matType);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,(char *)matType,sVar1)
      ;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,".y, ",4);
    if (matType == (DataType *)0x0) {
      std::ios::clear((int)auStack_198 + (int)*(undefined8 *)(local_190[0] + -0x18) + 8);
    }
    else {
      sVar1 = strlen((char *)matType);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,(char *)matType,sVar1)
      ;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,".z+",3);
    if (matType == (DataType *)0x0) {
      std::ios::clear((int)auStack_198 + (int)*(undefined8 *)(local_190[0] + -0x18) + 8);
    }
    else {
      sVar1 = strlen((char *)matType);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,(char *)matType,sVar1)
      ;
    }
    lVar2 = 2;
    pcVar3 = ".w";
    break;
  case 5:
    if (matType == (DataType *)0x0) {
      std::ios::clear((int)auStack_198 + (int)*(undefined8 *)(local_190[0] + -0x18) + 8);
    }
    else {
      sVar1 = strlen((char *)matType);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,(char *)matType,sVar1)
      ;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"[0][0], ",8);
    if (matType == (DataType *)0x0) {
      std::ios::clear((int)auStack_198 + (int)*(undefined8 *)(local_190[0] + -0x18) + 8);
    }
    else {
      sVar1 = strlen((char *)matType);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,(char *)matType,sVar1)
      ;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"[1][0], ",8);
    if (matType == (DataType *)0x0) {
      std::ios::clear((int)auStack_198 + (int)*(undefined8 *)(local_190[0] + -0x18) + 8);
    }
    else {
      sVar1 = strlen((char *)matType);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,(char *)matType,sVar1)
      ;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"[0][1]+",7);
    if (matType == (DataType *)0x0) {
      std::ios::clear((int)auStack_198 + (int)*(undefined8 *)(local_190[0] + -0x18) + 8);
    }
    else {
      sVar1 = strlen((char *)matType);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,(char *)matType,sVar1)
      ;
    }
    lVar2 = 6;
    pcVar3 = "[1][1]";
    break;
  case 6:
    if (matType == (DataType *)0x0) {
      std::ios::clear((int)auStack_198 + (int)*(undefined8 *)(local_190[0] + -0x18) + 8);
    }
    else {
      sVar1 = strlen((char *)matType);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,(char *)matType,sVar1)
      ;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"[0] + ",6);
    if (matType == (DataType *)0x0) {
      std::ios::clear((int)auStack_198 + (int)*(undefined8 *)(local_190[0] + -0x18) + 8);
    }
    else {
      sVar1 = strlen((char *)matType);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,(char *)matType,sVar1)
      ;
    }
    lVar2 = 3;
    pcVar3 = "[1]";
    break;
  case 7:
    if (matType == (DataType *)0x0) {
      std::ios::clear((int)auStack_198 + (int)*(undefined8 *)(local_190[0] + -0x18) + 8);
    }
    else {
      sVar1 = strlen((char *)matType);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,(char *)matType,sVar1)
      ;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"[0].xyz + ",10);
    if (matType == (DataType *)0x0) {
      std::ios::clear((int)auStack_198 + (int)*(undefined8 *)(local_190[0] + -0x18) + 8);
    }
    else {
      sVar1 = strlen((char *)matType);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,(char *)matType,sVar1)
      ;
    }
    lVar2 = 7;
    pcVar3 = "[1].yzw";
    break;
  case 8:
    if (matType == (DataType *)0x0) {
      std::ios::clear((int)auStack_198 + (int)*(undefined8 *)(local_190[0] + -0x18) + 8);
    }
    else {
      sVar1 = strlen((char *)matType);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,(char *)matType,sVar1)
      ;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"[0][0]+",7);
    if (matType == (DataType *)0x0) {
      std::ios::clear((int)auStack_198 + (int)*(undefined8 *)(local_190[0] + -0x18) + 8);
    }
    else {
      sVar1 = strlen((char *)matType);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,(char *)matType,sVar1)
      ;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"[0][1], ",8);
    if (matType == (DataType *)0x0) {
      std::ios::clear((int)auStack_198 + (int)*(undefined8 *)(local_190[0] + -0x18) + 8);
    }
    else {
      sVar1 = strlen((char *)matType);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,(char *)matType,sVar1)
      ;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"[1][0]+",7);
    if (matType == (DataType *)0x0) {
      std::ios::clear((int)auStack_198 + (int)*(undefined8 *)(local_190[0] + -0x18) + 8);
    }
    else {
      sVar1 = strlen((char *)matType);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,(char *)matType,sVar1)
      ;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"[1][1], ",8);
    if (matType == (DataType *)0x0) {
      std::ios::clear((int)auStack_198 + (int)*(undefined8 *)(local_190[0] + -0x18) + 8);
    }
    else {
      sVar1 = strlen((char *)matType);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,(char *)matType,sVar1)
      ;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"[2][0]+",7);
    goto LAB_005e310c;
  case 9:
    if (matType == (DataType *)0x0) {
      std::ios::clear((int)auStack_198 + (int)*(undefined8 *)(local_190[0] + -0x18) + 8);
    }
    else {
      sVar1 = strlen((char *)matType);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,(char *)matType,sVar1)
      ;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"[0] + ",6);
    if (matType == (DataType *)0x0) {
      std::ios::clear((int)auStack_198 + (int)*(undefined8 *)(local_190[0] + -0x18) + 8);
    }
    else {
      sVar1 = strlen((char *)matType);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,(char *)matType,sVar1)
      ;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"[1] + ",6);
    if (matType == (DataType *)0x0) {
      std::ios::clear((int)auStack_198 + (int)*(undefined8 *)(local_190[0] + -0x18) + 8);
    }
    else {
      sVar1 = strlen((char *)matType);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,(char *)matType,sVar1)
      ;
    }
    lVar2 = 3;
    pcVar3 = "[2]";
    break;
  case 10:
    if (matType == (DataType *)0x0) {
      std::ios::clear((int)auStack_198 + (int)*(undefined8 *)(local_190[0] + -0x18) + 8);
    }
    else {
      sVar1 = strlen((char *)matType);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,(char *)matType,sVar1)
      ;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"[0].xyz + ",10);
    if (matType == (DataType *)0x0) {
      std::ios::clear((int)auStack_198 + (int)*(undefined8 *)(local_190[0] + -0x18) + 8);
    }
    else {
      sVar1 = strlen((char *)matType);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,(char *)matType,sVar1)
      ;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"[1].yzw + ",10);
    if (matType == (DataType *)0x0) {
      std::ios::clear((int)auStack_198 + (int)*(undefined8 *)(local_190[0] + -0x18) + 8);
    }
    else {
      sVar1 = strlen((char *)matType);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,(char *)matType,sVar1)
      ;
    }
    lVar2 = 7;
    pcVar3 = "[2].zwx";
    break;
  case 0xb:
    if (matType == (DataType *)0x0) {
      std::ios::clear((int)auStack_198 + (int)*(undefined8 *)(local_190[0] + -0x18) + 8);
    }
    else {
      sVar1 = strlen((char *)matType);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,(char *)matType,sVar1)
      ;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"[0][0]+",7);
    if (matType == (DataType *)0x0) {
      std::ios::clear((int)auStack_198 + (int)*(undefined8 *)(local_190[0] + -0x18) + 8);
    }
    else {
      sVar1 = strlen((char *)matType);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,(char *)matType,sVar1)
      ;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"[0][1]+",7);
    if (matType == (DataType *)0x0) {
      std::ios::clear((int)auStack_198 + (int)*(undefined8 *)(local_190[0] + -0x18) + 8);
    }
    else {
      sVar1 = strlen((char *)matType);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,(char *)matType,sVar1)
      ;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"[3][0], ",8);
    if (matType == (DataType *)0x0) {
      std::ios::clear((int)auStack_198 + (int)*(undefined8 *)(local_190[0] + -0x18) + 8);
    }
    else {
      sVar1 = strlen((char *)matType);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,(char *)matType,sVar1)
      ;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"[1][0]+",7);
    if (matType == (DataType *)0x0) {
      std::ios::clear((int)auStack_198 + (int)*(undefined8 *)(local_190[0] + -0x18) + 8);
    }
    else {
      sVar1 = strlen((char *)matType);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,(char *)matType,sVar1)
      ;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"[1][1]+",7);
    if (matType == (DataType *)0x0) {
      std::ios::clear((int)auStack_198 + (int)*(undefined8 *)(local_190[0] + -0x18) + 8);
    }
    else {
      sVar1 = strlen((char *)matType);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,(char *)matType,sVar1)
      ;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"[3][1], ",8);
    if (matType == (DataType *)0x0) {
      std::ios::clear((int)auStack_198 + (int)*(undefined8 *)(local_190[0] + -0x18) + 8);
    }
    else {
      sVar1 = strlen((char *)matType);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,(char *)matType,sVar1)
      ;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"[2][0]+",7);
LAB_005e310c:
    if (matType == (DataType *)0x0) {
      std::ios::clear((int)auStack_198 + (int)*(undefined8 *)(local_190[0] + -0x18) + 8);
    }
    else {
      sVar1 = strlen((char *)matType);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,(char *)matType,sVar1)
      ;
    }
    lVar2 = 6;
    pcVar3 = "[2][1]";
    break;
  case 0xc:
    if (matType == (DataType *)0x0) {
      std::ios::clear((int)auStack_198 + (int)*(undefined8 *)(local_190[0] + -0x18) + 8);
    }
    else {
      sVar1 = strlen((char *)matType);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,(char *)matType,sVar1)
      ;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"[0] + ",6);
    if (matType == (DataType *)0x0) {
      std::ios::clear((int)auStack_198 + (int)*(undefined8 *)(local_190[0] + -0x18) + 8);
    }
    else {
      sVar1 = strlen((char *)matType);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,(char *)matType,sVar1)
      ;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"[1] + ",6);
    if (matType == (DataType *)0x0) {
      std::ios::clear((int)auStack_198 + (int)*(undefined8 *)(local_190[0] + -0x18) + 8);
    }
    else {
      sVar1 = strlen((char *)matType);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,(char *)matType,sVar1)
      ;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"[2] + ",6);
    if (matType == (DataType *)0x0) {
      std::ios::clear((int)auStack_198 + (int)*(undefined8 *)(local_190[0] + -0x18) + 8);
    }
    else {
      sVar1 = strlen((char *)matType);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,(char *)matType,sVar1)
      ;
    }
    lVar2 = 3;
    pcVar3 = "[3]";
    break;
  case 0xd:
    if (matType == (DataType *)0x0) {
      std::ios::clear((int)auStack_198 + (int)*(undefined8 *)(local_190[0] + -0x18) + 8);
    }
    else {
      sVar1 = strlen((char *)matType);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,(char *)matType,sVar1)
      ;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"[0].xyz+",8);
    if (matType == (DataType *)0x0) {
      std::ios::clear((int)auStack_198 + (int)*(undefined8 *)(local_190[0] + -0x18) + 8);
    }
    else {
      sVar1 = strlen((char *)matType);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,(char *)matType,sVar1)
      ;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"[1].yzw+",8);
    if (matType == (DataType *)0x0) {
      std::ios::clear((int)auStack_198 + (int)*(undefined8 *)(local_190[0] + -0x18) + 8);
    }
    else {
      sVar1 = strlen((char *)matType);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,(char *)matType,sVar1)
      ;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"[2].zwx+",8);
    if (matType == (DataType *)0x0) {
      std::ios::clear((int)auStack_198 + (int)*(undefined8 *)(local_190[0] + -0x18) + 8);
    }
    else {
      sVar1 = strlen((char *)matType);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,(char *)matType,sVar1)
      ;
    }
    lVar2 = 7;
    pcVar3 = "[3].wxy";
    break;
  default:
    goto switchD_005e223d_default;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,pcVar3,lVar2);
switchD_005e223d_default:
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_190);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

std::string ShaderMatrixCase::genGLSLMatToVec3Reduction (const glu::DataType& matType, const char* varName)
{
	std::ostringstream op;

	switch (matType)
	{
		case TYPE_FLOAT:		op << varName << ", "			<< varName << ", "			<< varName << "";																																			break;
		case TYPE_FLOAT_VEC2:	op << varName << ".x, "			<< varName << ".y, "		<< varName << ".x";																																			break;
		case TYPE_FLOAT_VEC3:	op << varName << "";																																																	break;
		case TYPE_FLOAT_VEC4:	op << varName << ".x, "			<< varName << ".y, "		<< varName << ".z+"			<< varName << ".w";																												break;
		case TYPE_FLOAT_MAT2:	op << varName << "[0][0], "		<< varName << "[1][0], "	<< varName << "[0][1]+"		<< varName << "[1][1]";																											break;
		case TYPE_FLOAT_MAT2X3:	op << varName << "[0] + "		<< varName << "[1]";																																									break;
		case TYPE_FLOAT_MAT2X4:	op << varName << "[0].xyz + "	<< varName << "[1].yzw";																																								break;
		case TYPE_FLOAT_MAT3X2:	op << varName << "[0][0]+"		<< varName << "[0][1], "	<< varName << "[1][0]+"		<< varName << "[1][1], "	<< varName << "[2][0]+" << varName << "[2][1]";														break;
		case TYPE_FLOAT_MAT3:	op << varName << "[0] + "		<< varName << "[1] + "		<< varName << "[2]";																																		break;
		case TYPE_FLOAT_MAT3X4:	op << varName << "[0].xyz + "	<< varName << "[1].yzw + "	<< varName << "[2].zwx";																																	break;
		case TYPE_FLOAT_MAT4X2:	op << varName << "[0][0]+"		<< varName << "[0][1]+"		<< varName << "[3][0], "	<< varName << "[1][0]+"		<< varName << "[1][1]+" << varName << "[3][1], " << varName << "[2][0]+" << varName << "[2][1]";	break;
		case TYPE_FLOAT_MAT4X3:	op << varName << "[0] + "		<< varName << "[1] + "		<< varName << "[2] + "		<< varName << "[3]";																											break;
		case TYPE_FLOAT_MAT4:	op << varName << "[0].xyz+"		<< varName << "[1].yzw+"	<< varName << "[2].zwx+"	<< varName << "[3].wxy";																										break;

		default:
			DE_ASSERT(DE_FALSE);
	}

	return op.str();
}